

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_draw.cpp
# Opt level: O2

void __thiscall
Am_Drawonable_Impl::set_gc_using_line(Am_Drawonable_Impl *this,Am_Style *line,Am_Draw_Function f)

{
  int iVar1;
  unsigned_long fore_index;
  Am_Wrapper *value;
  Am_Style_Data *this_00;
  short thickness;
  unsigned_long mask;
  Am_Image_Array stipple;
  Am_Fill_Solid_Flag fill_flag;
  int dash_l_length;
  Am_Line_Solid_Flag line_flag;
  Am_Join_Style_Flag join;
  Am_Line_Cap_Style_Flag cap;
  char *dash_l;
  Am_Fill_Poly_Flag poly;
  XGCValues values;
  
  mask = 0;
  Am_Image_Array::Am_Image_Array(&stipple);
  Am_Style::Get_Values
            (line,&thickness,&cap,&join,&line_flag,&dash_l,&dash_l_length,&fill_flag,&poly,&stipple)
  ;
  if (f == Am_DRAW_MASK_COPY) {
    fore_index = Am_Style_Data::Get_X_Index(&Am_On_Bits_Data,this);
  }
  else {
    value = Am_Style::operator_cast_to_Am_Wrapper_(line);
    this_00 = Am_Style_Data::Narrow(value);
    fore_index = Am_Style_Data::Get_X_Index(this_00,this);
    Am_Wrapper::Release(&this_00->super_Am_Wrapper);
  }
  iVar1 = XGetGCValues(this->screen->display,this->screen->gc,Am_GC_getmask,&values);
  if (iVar1 != 0) {
    adjust_gcvalues_color_drawfn(this,&values,&mask,fore_index,f);
    if (values.line_width != thickness) {
      mask = mask | 0x10;
      values.line_width = (int)thickness;
    }
    adjust_gcvalues_capstyle(&values,&mask,cap);
    adjust_gcvalues_joinstyle(&values,&mask,join);
    adjust_gcvalues_stipple(this,&values,&mask,fill_flag,&stipple);
    mask = mask | 0x20;
    if (line_flag < 2) {
      values.line_style = line_flag;
    }
    XChangeGC(this->screen->display,this->screen->gc,mask,&values);
    if (dash_l_length != 0) {
      XSetDashes(this->screen->display,this->screen->gc,0,dash_l);
    }
    Am_Image_Array::~Am_Image_Array(&stipple);
    return;
  }
  Am_Error("** set_gc_using_line: could not get GC values.\n");
}

Assistant:

void
Am_Drawonable_Impl::set_gc_using_line(const Am_Style &line,
                                      Am_Draw_Function f) const
{
  XGCValues values;
  unsigned long mask = 0;

  short thickness;
  Am_Line_Cap_Style_Flag cap;
  Am_Join_Style_Flag join;
  Am_Line_Solid_Flag line_flag;
  const char *dash_l;
  int dash_l_length;
  Am_Fill_Solid_Flag fill_flag;
  Am_Fill_Poly_Flag poly;
  Am_Image_Array stipple;

  line.Get_Values(thickness, cap, join, line_flag, dash_l, dash_l_length,
                  fill_flag, poly, stipple);

  unsigned long fore_index;
  if (f != Am_DRAW_MASK_COPY) {
    //declare colors are Am_Style_Impls so can call Get_X_Index
    Am_Style_Data *lin = Am_Style_Data::Narrow(line);
    fore_index = lin->Get_X_Index(this);
    if (lin)
      lin->Release();
  } else
    fore_index = Am_On_Bits_Data.Get_X_Index(this);

  if (XGetGCValues(screen->display, screen->gc, Am_GC_getmask, &values) == 0)
    Am_Error("** set_gc_using_line: could not get GC values.\n");

  adjust_gcvalues_color_drawfn(values, mask, fore_index, f);
  adjust_gcvalues_thickness(values, mask, thickness);
  adjust_gcvalues_capstyle(values, mask, cap);
  adjust_gcvalues_joinstyle(values, mask, join);
  adjust_gcvalues_stipple(values, mask, fill_flag, stipple);

  // You can't query the GC about its current dash pattern, so you have
  // to set it every time.  Fix this by storing the old value in the
  // screen object, so you can compare (without relying on X functions).
  mask |= GCLineStyle;
  switch (line_flag) {
  case Am_LINE_SOLID:
    values.line_style = LineSolid;
    break;
  case Am_LINE_ON_OFF_DASH:
    values.line_style = LineOnOffDash;
    break;
    // not supported
    //     case Am_LINE_DOUBLE_DASH:
    //       values.line_style = LineDoubleDash;
    //       break;
  }

  if (mask) {
    XChangeGC(screen->display, screen->gc, mask, &values);
  }

  // XSetDashes call must be called after XChangeGC
  //
  if (dash_l_length)
    XSetDashes(screen->display, screen->gc, 0, dash_l, dash_l_length);
}